

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O0

void __thiscall CRegister::RegisterGotCount(CRegister *this,CNetChunk *pChunk)

{
  uint uVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int i;
  int Count;
  uchar *pData;
  int iVar3;
  NETADDR *a;
  
  a = *(NETADDR **)(in_RSI + 0x28);
  uVar1 = (uint)CONCAT11(a->ip[4],a->ip[5]);
  iVar3 = 0;
  while( true ) {
    if (3 < iVar3) {
      return;
    }
    iVar2 = net_addr_comp(a,(NETADDR *)CONCAT44(uVar1,iVar3),(int)((ulong)in_RDI >> 0x20));
    if (iVar2 == 0) break;
    iVar3 = iVar3 + 1;
  }
  *(uint *)(in_RDI + (long)iVar3 * 0x28 + 0x50) = uVar1;
  return;
}

Assistant:

void CRegister::RegisterGotCount(CNetChunk *pChunk)
{
	unsigned char *pData = (unsigned char *)pChunk->m_pData;
	int Count = (pData[sizeof(SERVERBROWSE_COUNT)]<<8) | pData[sizeof(SERVERBROWSE_COUNT)+1];

	for(int i = 0; i < IMasterServer::MAX_MASTERSERVERS; i++)
	{
		if(net_addr_comp(&m_aMasterserverInfo[i].m_Addr, &pChunk->m_Address, true) == 0)
		{
			m_aMasterserverInfo[i].m_Count = Count;
			break;
		}
	}
}